

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O0

RK_S32 get_afbc_min_size(RK_S32 width,RK_S32 height,RK_S32 bpp)

{
  int iVar1;
  RK_S32 size;
  RK_S32 hdr_alignment;
  RK_S32 n_blocks;
  RK_S32 bpp_local;
  RK_S32 height_local;
  RK_S32 width_local;
  
  iVar1 = (int)((width + 0xfU & 0xfffffff0) * (height + 0xfU & 0xfffffff0)) / 0x100;
  return iVar1 * ((bpp << 8) / 8 + 0x7fU & 0xffffff80) + (iVar1 * 0x10 + 0x3fU & 0xffffffc0);
}

Assistant:

static RK_S32 get_afbc_min_size(RK_S32 width, RK_S32 height, RK_S32 bpp)
{
#define AFBC_HEADER_SIZE 16
#define AFBC_HDR_ALIGN 64
#define AFBC_SUPERBLOCK_PIXELS 256
#define AFBC_SUPERBLOCK_ALIGNMENT 128

    RK_S32 n_blocks, hdr_alignment, size;

    /* AFBC_FORMAT_MOD_BLOCK_SIZE_16x16 and !AFBC_FORMAT_MOD_TILED */
    width = MPP_ALIGN(width, 16);
    height = MPP_ALIGN(height, 16);
    hdr_alignment = AFBC_HDR_ALIGN;

    n_blocks = (width * height) / AFBC_SUPERBLOCK_PIXELS;

    size = MPP_ALIGN(n_blocks * AFBC_HEADER_SIZE, hdr_alignment);
    size += n_blocks * MPP_ALIGN(bpp * AFBC_SUPERBLOCK_PIXELS / 8,
                                 AFBC_SUPERBLOCK_ALIGNMENT);
    return size;
}